

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_line_element.hpp
# Opt level: O3

void __thiscall UrlLineElement::~UrlLineElement(UrlLineElement *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_LineElement)._vptr_LineElement = (_func_int **)&PTR__UrlLineElement_001079f0;
  pcVar1 = (this->_url)._M_dataplus._M_p;
  paVar2 = &(this->_url).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  (this->super_LineElement)._vptr_LineElement = (_func_int **)&PTR__LineElement_00107978;
  pcVar1 = (this->super_LineElement)._content._M_dataplus._M_p;
  paVar2 = &(this->super_LineElement)._content.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~UrlLineElement() {}